

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O2

uint64 mkvmuxer::EbmlElementSize(uint64 type,uint64 value,uint64 fixed_size)

{
  uint uVar1;
  
  if (fixed_size == 0) {
    uVar1 = GetUIntSize(value);
    fixed_size = (uint64)uVar1;
  }
  uVar1 = GetUIntSize(type);
  return uVar1 + fixed_size + 1;
}

Assistant:

uint64 EbmlElementSize(uint64 type, uint64 value, uint64 fixed_size) {
  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += (fixed_size > 0) ? fixed_size : GetUIntSize(value);

  // Size of Datasize
  ebml_size++;

  return ebml_size;
}